

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  RayHitK<4> *pRVar4;
  RayHitK<4> *pRVar5;
  RayHitK<4> *pRVar6;
  RayHitK<4> *pRVar7;
  AccelData *pAVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  uint uVar31;
  undefined4 uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  ulong *puVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  float fVar46;
  vint4 ai;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar108;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar110;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar120;
  uint uVar121;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  uint uVar122;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  float fVar126;
  float fVar130;
  float fVar131;
  vint4 bi_4;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  uint uVar133;
  undefined1 auVar129 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 bi_3;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1398;
  ulong uStack_1390;
  undefined1 local_1378 [8];
  float fStack_1370;
  float fStack_136c;
  undefined1 local_1348 [8];
  float fStack_1340;
  float fStack_133c;
  undefined1 local_1338 [16];
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [12];
  float fStack_11cc;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1108 [3] [16];
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  uint local_fc8;
  uint uStack_fc4;
  uint uStack_fc0;
  uint uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 local_f70 [2];
  ulong local_f68 [487];
  vint4 bi_9;
  undefined1 auVar119 [64];
  
  uVar30 = mm_lookupmask_ps._248_8_;
  uVar29 = mm_lookupmask_ps._240_8_;
  uVar28 = mm_lookupmask_ps._8_8_;
  uVar27 = mm_lookupmask_ps._0_8_;
  auVar134 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar135 = vpcmpeqd_avx(auVar134,(undefined1  [16])valid_i->field_0);
  uVar31 = vmovmskps_avx(auVar135);
  if (uVar31 == 0) {
    return;
  }
  pAVar8 = This->ptr;
  uVar34 = (ulong)(uVar31 & 0xff);
  auVar24 = *(undefined1 (*) [16])ray;
  local_10a8 = *(float *)(ray + 0x10);
  auVar25 = *(undefined1 (*) [16])(ray + 0x10);
  local_10b8 = *(float *)(ray + 0x20);
  auVar26 = *(undefined1 (*) [16])(ray + 0x20);
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar136 = *(undefined1 (*) [16])(ray + 0x40);
  auVar85 = vandps_avx(auVar136,auVar95);
  auVar94._8_4_ = 0x219392ef;
  auVar94._0_8_ = 0x219392ef219392ef;
  auVar94._12_4_ = 0x219392ef;
  auVar85 = vcmpps_avx(auVar85,auVar94,1);
  auVar9 = vblendvps_avx(auVar136,auVar94,auVar85);
  auVar85 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar95);
  auVar85 = vcmpps_avx(auVar85,auVar94,1);
  auVar10 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar94,auVar85);
  auVar85 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar95);
  auVar85 = vcmpps_avx(auVar85,auVar94,1);
  auVar85 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar94,auVar85);
  auVar94 = vrcpps_avx(auVar9);
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = &DAT_3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar94,auVar127);
  auVar94 = vfmadd132ps_fma(auVar9,auVar94,auVar94);
  auVar9 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar9,auVar127);
  auVar10 = vfmadd132ps_fma(auVar10,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar85);
  auVar85 = vfnmadd213ps_fma(auVar85,auVar9,auVar127);
  auVar127 = vfmadd132ps_fma(auVar85,auVar9,auVar9);
  auVar97 = ZEXT816(0);
  auVar9 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar97);
  pRVar7 = ray + 0x80;
  local_10c8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar97);
  auVar136 = vcmpps_avx(auVar136,auVar97,1);
  auVar85._8_4_ = 1;
  auVar85._0_8_ = 0x100000001;
  auVar85._12_4_ = 1;
  auVar136 = vandps_avx(auVar136,auVar85);
  auVar85 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar97,1);
  auVar96._8_4_ = 2;
  auVar96._0_8_ = 0x200000002;
  auVar96._12_4_ = 2;
  auVar85 = vandps_avx(auVar85,auVar96);
  auVar85 = vorps_avx(auVar85,auVar136);
  auVar136 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar97,1);
  auVar97._8_4_ = 4;
  auVar97._0_8_ = 0x400000004;
  auVar97._12_4_ = 4;
  auVar136 = vandps_avx(auVar136,auVar97);
  auVar134 = vpor_avx(auVar135 ^ auVar134,auVar136);
  local_1108[0] = vpor_avx(auVar134,auVar85);
  local_1098 = *(float *)ray;
  fStack_1094 = *(float *)(ray + 4);
  fStack_1090 = *(float *)(ray + 8);
  fStack_108c = *(float *)(ray + 0xc);
  auVar134._0_4_ = auVar94._0_4_ * -*(float *)ray;
  auVar134._4_4_ = auVar94._4_4_ * -*(float *)(ray + 4);
  auVar134._8_4_ = auVar94._8_4_ * -*(float *)(ray + 8);
  auVar134._12_4_ = auVar94._12_4_ * -*(float *)(ray + 0xc);
  fStack_10a4 = *(float *)(ray + 0x14);
  fStack_10a0 = *(float *)(ray + 0x18);
  fStack_109c = *(float *)(ray + 0x1c);
  auVar135._0_4_ = auVar10._0_4_ * -local_10a8;
  auVar135._4_4_ = auVar10._4_4_ * -*(float *)(ray + 0x14);
  auVar135._8_4_ = auVar10._8_4_ * -*(float *)(ray + 0x18);
  auVar135._12_4_ = auVar10._12_4_ * -*(float *)(ray + 0x1c);
  fStack_10b4 = *(float *)(ray + 0x24);
  fStack_10b0 = *(float *)(ray + 0x28);
  fStack_10ac = *(float *)(ray + 0x2c);
  auVar125 = ZEXT864(0) << 0x20;
  auVar136._0_4_ = auVar127._0_4_ * -local_10b8;
  auVar136._4_4_ = auVar127._4_4_ * -*(float *)(ray + 0x24);
  auVar136._8_4_ = auVar127._8_4_ * -*(float *)(ray + 0x28);
  auVar136._12_4_ = auVar127._12_4_ * -*(float *)(ray + 0x2c);
  local_1108[2]._0_8_ = mm_lookupmask_ps._0_8_;
  local_1108[2]._8_8_ = mm_lookupmask_ps._8_8_;
  local_1108[1]._0_8_ = mm_lookupmask_ps._240_8_;
  local_1108[1]._8_8_ = mm_lookupmask_ps._248_8_;
  local_10d8 = 0x7f800000;
  uStack_10d4 = 0x7f800000;
  uStack_10d0 = 0x7f800000;
  uStack_10cc = 0x7f800000;
LAB_00575e8f:
  lVar39 = 0;
  for (uVar37 = uVar34; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    lVar39 = lVar39 + 1;
  }
  uVar32 = *(undefined4 *)(local_1108[0] + lVar39 * 4);
  auVar47._4_4_ = uVar32;
  auVar47._0_4_ = uVar32;
  auVar47._8_4_ = uVar32;
  auVar47._12_4_ = uVar32;
  auVar112 = vpcmpeqd_avx(auVar47,local_1108[0]);
  uVar32 = vmovmskps_avx(auVar112);
  uVar34 = ~CONCAT44((int)((ulong)lVar39 >> 0x20),uVar32) & uVar34;
  auVar98._8_4_ = 0x7f800000;
  auVar98._0_8_ = 0x7f8000007f800000;
  auVar98._12_4_ = 0x7f800000;
  auVar85 = vblendvps_avx(auVar98,auVar94,auVar112);
  auVar96 = vshufps_avx(auVar85,auVar85,0xb1);
  auVar96 = vminps_avx(auVar96,auVar85);
  auVar97 = vshufpd_avx(auVar96,auVar96,1);
  auVar85 = vblendvps_avx(auVar98,auVar10,auVar112);
  auVar96 = vminps_avx(auVar97,auVar96);
  auVar97 = vshufps_avx(auVar85,auVar85,0xb1);
  auVar85 = vminps_avx(auVar97,auVar85);
  auVar97 = vshufpd_avx(auVar85,auVar85,1);
  auVar85 = vminps_avx(auVar97,auVar85);
  auVar96 = vinsertps_avx(auVar96,auVar85,0x1c);
  auVar85 = vblendvps_avx(auVar98,auVar127,auVar112);
  auVar97 = vshufps_avx(auVar85,auVar85,0xb1);
  auVar85 = vminps_avx(auVar97,auVar85);
  auVar97 = vshufpd_avx(auVar85,auVar85,1);
  auVar85 = vminps_avx(auVar97,auVar85);
  auVar72 = vinsertps_avx(auVar96,auVar85,0x20);
  auVar111._8_4_ = 0xff800000;
  auVar111._0_8_ = 0xff800000ff800000;
  auVar111._12_4_ = 0xff800000;
  auVar85 = vblendvps_avx(auVar111,auVar94,auVar112);
  auVar96 = vshufps_avx(auVar85,auVar85,0xb1);
  auVar96 = vmaxps_avx(auVar96,auVar85);
  auVar97 = vshufpd_avx(auVar96,auVar96,1);
  auVar85 = vblendvps_avx(auVar111,auVar10,auVar112);
  auVar96 = vmaxps_avx(auVar97,auVar96);
  auVar97 = vshufps_avx(auVar85,auVar85,0xb1);
  auVar85 = vmaxps_avx(auVar97,auVar85);
  auVar97 = vshufpd_avx(auVar85,auVar85,1);
  auVar85 = vmaxps_avx(auVar97,auVar85);
  auVar96 = vinsertps_avx(auVar96,auVar85,0x1c);
  auVar85 = vblendvps_avx(auVar111,auVar127,auVar112);
  auVar97 = vshufps_avx(auVar85,auVar85,0xb1);
  auVar85 = vmaxps_avx(auVar97,auVar85);
  auVar97 = vshufpd_avx(auVar85,auVar85,1);
  auVar85 = vmaxps_avx(auVar97,auVar85);
  auVar86 = vinsertps_avx(auVar96,auVar85,0x20);
  auVar47 = vcmpps_avx(auVar72,auVar125._0_16_,5);
  auVar85 = vblendvps_avx(auVar86,auVar72,auVar47);
  auVar96 = vmovshdup_avx(auVar85);
  uVar45 = (ulong)(auVar96._0_4_ < 0.0) << 4 | 0x20;
  auVar96 = vshufpd_avx(auVar85,auVar85,1);
  uVar44 = (ulong)(auVar96._0_4_ < 0.0) << 4 | 0x40;
  local_11c8._4_4_ = auVar85._0_4_;
  auVar96 = vblendvps_avx(auVar98,auVar24,auVar112);
  auVar97 = vshufps_avx(auVar96,auVar96,0xb1);
  auVar96 = vminps_avx(auVar97,auVar96);
  auVar97 = vshufpd_avx(auVar96,auVar96,1);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar96 = vblendvps_avx(auVar98,auVar25,auVar112);
  auVar113 = vshufps_avx(auVar96,auVar96,0xb1);
  auVar96 = vminps_avx(auVar113,auVar96);
  auVar113 = vshufpd_avx(auVar96,auVar96,1);
  auVar96 = vminps_avx(auVar113,auVar96);
  auVar97 = vinsertps_avx(auVar97,auVar96,0x1c);
  auVar96 = vblendvps_avx(auVar98,auVar26,auVar112);
  auVar113 = vshufps_avx(auVar96,auVar96,0xb1);
  auVar96 = vminps_avx(auVar113,auVar96);
  auVar113 = vshufpd_avx(auVar96,auVar96,1);
  auVar96 = vminps_avx(auVar113,auVar96);
  auVar97 = vinsertps_avx(auVar97,auVar96,0x20);
  auVar96 = vblendvps_avx(auVar111,auVar24,auVar112);
  auVar113 = vshufps_avx(auVar96,auVar96,0xb1);
  auVar96 = vmaxps_avx(auVar113,auVar96);
  auVar113 = vshufpd_avx(auVar96,auVar96,1);
  auVar113 = vmaxps_avx(auVar113,auVar96);
  auVar96 = vblendvps_avx(auVar111,auVar25,auVar112);
  auVar98 = vshufps_avx(auVar96,auVar96,0xb1);
  auVar96 = vmaxps_avx(auVar98,auVar96);
  auVar98 = vshufpd_avx(auVar96,auVar96,1);
  auVar96 = vmaxps_avx(auVar98,auVar96);
  auVar113 = vinsertps_avx(auVar113,auVar96,0x1c);
  auVar96 = vblendvps_avx(auVar111,auVar26,auVar112);
  auVar98 = vshufps_avx(auVar96,auVar96,0xb1);
  auVar96 = vmaxps_avx(auVar98,auVar96);
  auVar98 = vshufpd_avx(auVar96,auVar96,1);
  auVar96 = vmaxps_avx(auVar98,auVar96);
  auVar113 = vinsertps_avx(auVar113,auVar96,0x20);
  auVar125 = ZEXT864(0) << 0x20;
  auVar96 = vblendvps_avx(auVar113,auVar97,auVar47);
  auVar97 = vblendvps_avx(auVar97,auVar113,auVar47);
  local_1338 = vblendvps_avx(auVar111,local_10c8,auVar112);
  auVar113 = vshufps_avx(local_1338,local_1338,0xb1);
  auVar98 = vmaxps_avx(auVar113,local_1338);
  auVar99 = vshufpd_avx(auVar98,auVar98,1);
  auVar78._8_4_ = 0x7f800000;
  auVar78._0_8_ = 0x7f8000007f800000;
  auVar78._12_4_ = 0x7f800000;
  auVar113 = vblendvps_avx(auVar78,auVar9,auVar112);
  auVar78 = vshufps_avx(auVar113,auVar113,0xb1);
  auVar78 = vminps_avx(auVar78,auVar113);
  auVar98 = vmaxss_avx(auVar99,auVar98);
  auVar113 = vblendvps_avx(auVar72,auVar86,auVar47);
  auVar99._0_4_ = auVar97._0_4_ * (float)local_11c8._4_4_;
  auVar99._4_4_ = auVar97._4_4_ * auVar85._4_4_;
  auVar99._8_4_ = auVar97._8_4_ * auVar85._8_4_;
  auVar99._12_4_ = auVar97._12_4_ * auVar85._12_4_;
  local_fd8 = auVar113._0_4_;
  auVar72._0_4_ = auVar96._0_4_ * local_fd8;
  auVar72._4_4_ = auVar96._4_4_ * auVar113._4_4_;
  auVar72._8_4_ = auVar96._8_4_ * auVar113._8_4_;
  auVar72._12_4_ = auVar96._12_4_ * auVar113._12_4_;
  uVar43 = (ulong)((float)local_11c8._4_4_ < 0.0) * 0x10;
  local_f78 = *(ulong *)&pAVar8[1].bounds.bounds0.lower.field_0;
  local_f70[0] = 0;
  local_11c8._0_4_ = local_11c8._4_4_;
  fStack_11c0 = (float)local_11c8._4_4_;
  fStack_11bc = (float)local_11c8._4_4_;
  uVar37 = CONCAT44(auVar99._0_4_,auVar99._0_4_);
  local_11d8._0_8_ = uVar37 ^ 0x8000000080000000;
  local_11d8._8_4_ = -auVar99._0_4_;
  fStack_11cc = -auVar99._0_4_;
  local_f98 = vshufps_avx(auVar85,auVar85,0x55);
  auVar96 = vshufps_avx(auVar99,auVar99,0x55);
  local_fa8._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
  local_fa8._8_4_ = auVar96._8_4_ ^ 0x80000000;
  local_fa8._12_4_ = auVar96._12_4_ ^ 0x80000000;
  local_fb8 = vshufps_avx(auVar85,auVar85,0xaa);
  auVar96 = vshufps_avx(auVar99,auVar99,0xaa);
  uStack_fc0 = auVar96._8_4_ ^ 0x80000000;
  uStack_fbc = auVar96._12_4_ ^ 0x80000000;
  local_fc8 = auVar96._0_4_ ^ 0x80000000;
  uStack_fc4 = auVar96._4_4_ ^ 0x80000000;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  local_fe8 = -auVar72._0_4_;
  fStack_fe4 = -auVar72._0_4_;
  fStack_fe0 = -auVar72._0_4_;
  fStack_fdc = -auVar72._0_4_;
  local_ff8 = vshufps_avx(auVar113,auVar113,0x55);
  uVar32 = auVar78._0_4_;
  auVar86._4_4_ = uVar32;
  auVar86._0_4_ = uVar32;
  auVar86._8_4_ = uVar32;
  auVar86._12_4_ = uVar32;
  auVar85 = vshufps_avx(auVar78,auVar78,0xaa);
  local_1008 = vminps_avx(auVar85,auVar86);
  auVar85 = vshufps_avx(auVar72,auVar72,0x55);
  local_1018._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
  local_1018._8_4_ = auVar85._8_4_ ^ 0x80000000;
  local_1018._12_4_ = auVar85._12_4_ ^ 0x80000000;
  local_1028 = vshufps_avx(auVar113,auVar113,0xaa);
  auVar85 = vshufps_avx(auVar72,auVar72,0xaa);
  local_1038._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
  local_1038._8_4_ = auVar85._8_4_ ^ 0x80000000;
  local_1038._12_4_ = auVar85._12_4_ ^ 0x80000000;
  auVar113._8_4_ = 0x7f800000;
  auVar113._0_8_ = 0x7f8000007f800000;
  auVar113._12_4_ = 0x7f800000;
  auVar85 = vblendvps_avx(auVar113,auVar9,auVar112);
  puVar41 = local_f68;
  do {
    local_11b8._4_4_ = auVar98._0_4_;
    local_11b8._0_4_ = local_11b8._4_4_;
    local_11b8._8_4_ = local_11b8._4_4_;
    local_11b8._12_4_ = local_11b8._4_4_;
LAB_0057628f:
    do {
      do {
        if (puVar41 == &local_f78) {
          if (uVar34 == 0) {
            return;
          }
          goto LAB_00575e8f;
        }
        uVar32 = (undefined4)puVar41[-1];
        auVar112._4_4_ = uVar32;
        auVar112._0_4_ = uVar32;
        auVar112._8_4_ = uVar32;
        auVar112._12_4_ = uVar32;
        auVar119 = ZEXT1664(auVar112);
        puVar41 = puVar41 + -2;
        auVar97 = vcmpps_avx(auVar112,local_1338,1);
      } while ((((auVar97 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (auVar97 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar97 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar97[0xf]);
      uVar37 = *puVar41;
      while ((uVar37 & 8) == 0) {
        auVar97 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar43),_local_11d8,
                                  _local_11c8);
        auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar45),local_fa8,
                                   local_f98);
        auVar97 = vpmaxsd_avx(auVar97,auVar113);
        auVar15._8_4_ = uStack_fc0;
        auVar15._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
        auVar15._12_4_ = uStack_fbc;
        auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar44),auVar15,local_fb8)
        ;
        auVar113 = vpmaxsd_avx(auVar113,local_1008);
        local_f88 = vpmaxsd_avx(auVar97,auVar113);
        uVar33 = CONCAT44(auVar72._0_4_,auVar72._0_4_);
        auVar13._8_4_ = -auVar72._0_4_;
        auVar13._0_8_ = uVar33 ^ 0x8000000080000000;
        auVar13._12_4_ = -auVar72._0_4_;
        auVar14._4_4_ = local_fd8;
        auVar14._0_4_ = local_fd8;
        auVar14._8_4_ = local_fd8;
        auVar14._12_4_ = local_fd8;
        auVar97 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar43 ^ 0x10)),auVar13,
                                  auVar14);
        auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar45 ^ 0x10)),
                                   local_1018,local_ff8);
        auVar97 = vpminsd_avx(auVar97,auVar113);
        auVar113 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar44 ^ 0x10)),
                                   local_1038,local_1028);
        auVar113 = vpminsd_avx(auVar113,local_11b8);
        auVar97 = vpminsd_avx(auVar97,auVar113);
        auVar97 = vcmpps_avx(local_f88,auVar97,2);
        uVar31 = vmovmskps_avx(auVar97);
        if (uVar31 == 0) {
          bVar22 = false;
          uVar33 = uVar37;
        }
        else {
          uVar38 = (ulong)(uVar31 & 0xff);
          auVar119 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          uVar33 = 8;
          uVar35 = 0;
          do {
            lVar39 = 0;
            for (uVar12 = uVar38; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
            uVar32 = *(undefined4 *)(uVar37 + 0x20 + lVar39 * 4);
            auVar48._4_4_ = uVar32;
            auVar48._0_4_ = uVar32;
            auVar48._8_4_ = uVar32;
            auVar48._12_4_ = uVar32;
            auVar47 = vfmadd213ps_fma(auVar48,auVar94,auVar134);
            uVar32 = *(undefined4 *)(uVar37 + 0x40 + lVar39 * 4);
            auVar73._4_4_ = uVar32;
            auVar73._0_4_ = uVar32;
            auVar73._8_4_ = uVar32;
            auVar73._12_4_ = uVar32;
            auVar86 = vfmadd213ps_fma(auVar73,auVar10,auVar135);
            uVar32 = *(undefined4 *)(uVar37 + 0x60 + lVar39 * 4);
            auVar79._4_4_ = uVar32;
            auVar79._0_4_ = uVar32;
            auVar79._8_4_ = uVar32;
            auVar79._12_4_ = uVar32;
            auVar98 = vfmadd213ps_fma(auVar79,auVar127,auVar136);
            uVar32 = *(undefined4 *)(uVar37 + 0x30 + lVar39 * 4);
            auVar87._4_4_ = uVar32;
            auVar87._0_4_ = uVar32;
            auVar87._8_4_ = uVar32;
            auVar87._12_4_ = uVar32;
            auVar78 = vfmadd213ps_fma(auVar87,auVar94,auVar134);
            uVar32 = *(undefined4 *)(uVar37 + 0x50 + lVar39 * 4);
            auVar100._4_4_ = uVar32;
            auVar100._0_4_ = uVar32;
            auVar100._8_4_ = uVar32;
            auVar100._12_4_ = uVar32;
            auVar112 = vfmadd213ps_fma(auVar100,auVar10,auVar135);
            uVar32 = *(undefined4 *)(uVar37 + 0x70 + lVar39 * 4);
            auVar128._4_4_ = uVar32;
            auVar128._0_4_ = uVar32;
            auVar128._8_4_ = uVar32;
            auVar128._12_4_ = uVar32;
            auVar99 = vfmadd213ps_fma(auVar128,auVar127,auVar136);
            auVar97 = vpminsd_avx(auVar47,auVar78);
            auVar113 = vpminsd_avx(auVar86,auVar112);
            auVar97 = vpmaxsd_avx(auVar97,auVar113);
            auVar113 = vpminsd_avx(auVar98,auVar99);
            auVar113 = vpmaxsd_avx(auVar113,auVar85);
            auVar97 = vpmaxsd_avx(auVar97,auVar113);
            auVar113 = vpmaxsd_avx(auVar47,auVar78);
            auVar47 = vpmaxsd_avx(auVar86,auVar112);
            auVar47 = vpminsd_avx(auVar113,auVar47);
            auVar113 = vpmaxsd_avx(auVar98,auVar99);
            auVar113 = vpminsd_avx(auVar113,local_1338);
            auVar113 = vpminsd_avx(auVar47,auVar113);
            auVar97 = vcmpps_avx(auVar97,auVar113,2);
            if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar97 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar97 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar97[0xf]) {
              auVar125 = ZEXT1264(ZEXT812(0)) << 0x20;
            }
            else {
              uVar32 = *(undefined4 *)(local_f88 + lVar39 * 4);
              auVar49._4_4_ = uVar32;
              auVar49._0_4_ = uVar32;
              auVar49._8_4_ = uVar32;
              auVar49._12_4_ = uVar32;
              uVar12 = *(ulong *)(uVar37 + lVar39 * 8);
              auVar113 = auVar119._0_16_;
              auVar97 = vcmpps_avx(auVar49,auVar113,1);
              if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar97 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar97 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar97[0xf]) {
                *puVar41 = uVar12;
                auVar125 = ZEXT1264(ZEXT812(0)) << 0x20;
              }
              else {
                auVar125 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (uVar33 == 8) {
                  auVar119 = ZEXT1664(auVar49);
                  uVar33 = uVar12;
                  goto LAB_005764a0;
                }
                *puVar41 = uVar33;
                auVar119 = ZEXT1664(auVar49);
                uVar33 = uVar12;
                auVar49 = auVar113;
              }
              uVar35 = uVar35 + 1;
              *(int *)(puVar41 + 1) = auVar49._0_4_;
              puVar41 = puVar41 + 2;
            }
LAB_005764a0:
            uVar38 = uVar38 - 1 & uVar38;
          } while (uVar38 != 0);
          if (uVar33 == 8) {
            bVar22 = false;
          }
          else {
            bVar22 = true;
            if (1 < uVar35) {
              puVar1 = puVar41 + -4;
              puVar2 = puVar41 + -2;
              if ((uint)puVar41[-3] < (uint)puVar41[-1]) {
                local_1398 = *puVar1;
                uStack_1390 = puVar41[-3];
                *(int *)(puVar41 + -3) = (int)puVar41[-1];
                *puVar1 = *puVar2;
                *puVar2 = local_1398;
                *(undefined4 *)(puVar41 + -1) = (undefined4)uStack_1390;
              }
              if (uVar35 != 2) {
                puVar3 = puVar41 + -6;
                if ((uint)puVar41[-5] < (uint)puVar41[-1]) {
                  local_1398 = *puVar3;
                  uStack_1390 = puVar41[-5];
                  *(int *)(puVar41 + -5) = (int)puVar41[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = local_1398;
                  *(undefined4 *)(puVar41 + -1) = (undefined4)uStack_1390;
                }
                if ((uint)puVar41[-5] < (uint)puVar41[-3]) {
                  local_1398 = *puVar3;
                  uStack_1390 = puVar41[-5];
                  *(int *)(puVar41 + -5) = (int)puVar41[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = local_1398;
                  *(undefined4 *)(puVar41 + -3) = (undefined4)uStack_1390;
                }
              }
            }
          }
        }
        uVar37 = uVar33;
        if (!bVar22) goto LAB_0057628f;
      }
      auVar97 = vcmpps_avx(local_1338,auVar119._0_16_,6);
      if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar97 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar97 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar97[0xf])
      goto LAB_0057628f;
      uVar33 = (ulong)((uint)uVar37 & 0xf);
      if (uVar33 != 8) {
        pRVar4 = ray + 0x50;
        auVar23 = *(undefined1 (*) [12])pRVar4;
        local_11e8 = (float)*(undefined8 *)pRVar4;
        fStack_11e4 = (float)((ulong)*(undefined8 *)pRVar4 >> 0x20);
        fStack_11e0 = (float)*(undefined8 *)(ray + 0x58);
        fStack_11dc = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
        pRVar5 = ray + 0x60;
        pRVar6 = ray + 0x40;
        lVar39 = (uVar37 & 0xfffffffffffffff0) + 0xc0;
        lVar36 = 0;
        do {
          lVar42 = lVar36 * 0xe0 + (uVar37 & 0xfffffffffffffff0);
          lVar40 = 0;
          do {
            uVar31 = *(uint *)(lVar39 + lVar40 * 4);
            if ((ulong)uVar31 == 0xffffffff) break;
            local_1218._4_4_ = *(float *)(lVar39 + -0xc0 + lVar40 * 4);
            local_1218._0_4_ = local_1218._4_4_;
            fStack_1210 = (float)local_1218._4_4_;
            fStack_120c = (float)local_1218._4_4_;
            local_1348._4_4_ = *(float *)(lVar39 + -0xb0 + lVar40 * 4);
            fVar46 = *(float *)(lVar39 + -0xa0 + lVar40 * 4);
            auVar88._4_4_ = fVar46;
            auVar88._0_4_ = fVar46;
            auVar88._8_4_ = fVar46;
            auVar88._12_4_ = fVar46;
            local_12e8._4_4_ = *(float *)(lVar39 + -0x90 + lVar40 * 4);
            local_12f8._4_4_ = *(float *)(lVar39 + -0x80 + lVar40 * 4);
            local_1378._4_4_ = *(float *)(lVar39 + -0x70 + lVar40 * 4);
            local_1378._0_4_ = local_1378._4_4_;
            fStack_1370 = (float)local_1378._4_4_;
            fStack_136c = (float)local_1378._4_4_;
            local_1238._4_4_ = *(undefined4 *)(lVar39 + -0x60 + lVar40 * 4);
            local_1238._0_4_ = local_1238._4_4_;
            local_1238._8_4_ = local_1238._4_4_;
            local_1238._12_4_ = local_1238._4_4_;
            local_1248._4_4_ = *(undefined4 *)(lVar39 + -0x50 + lVar40 * 4);
            local_1248._0_4_ = local_1248._4_4_;
            local_1248._8_4_ = local_1248._4_4_;
            local_1248._12_4_ = local_1248._4_4_;
            local_1258._4_4_ = *(undefined4 *)(lVar39 + -0x40 + lVar40 * 4);
            local_1258._0_4_ = local_1258._4_4_;
            local_1258._8_4_ = local_1258._4_4_;
            local_1258._12_4_ = local_1258._4_4_;
            local_12c8._4_4_ = *(float *)(lVar39 + -0x30 + lVar40 * 4);
            local_12c8._0_4_ = local_12c8._4_4_;
            fStack_12c0 = (float)local_12c8._4_4_;
            fStack_12bc = (float)local_12c8._4_4_;
            local_11f8._4_4_ = *(float *)(lVar39 + -0x20 + lVar40 * 4);
            local_1208._4_4_ = *(float *)(lVar39 + -0x10 + lVar40 * 4);
            local_1398 = *(ulong *)(lVar42 + 0xd0);
            uStack_1390 = *(undefined8 *)(lVar42 + 0xd8);
            local_12e8._0_4_ = local_12e8._4_4_;
            fStack_12e0 = (float)local_12e8._4_4_;
            fStack_12dc = (float)local_12e8._4_4_;
            fVar69 = (float)local_1218._4_4_ - (float)local_12e8._4_4_;
            local_1058._4_4_ = fVar69;
            local_1058._0_4_ = fVar69;
            local_1058._8_4_ = fVar69;
            local_1058._12_4_ = fVar69;
            local_12f8._0_4_ = local_12f8._4_4_;
            fStack_12f0 = (float)local_12f8._4_4_;
            fStack_12ec = (float)local_12f8._4_4_;
            local_1348._0_4_ = local_1348._4_4_;
            fStack_1340 = (float)local_1348._4_4_;
            fStack_133c = (float)local_1348._4_4_;
            fVar71 = (float)local_1348._4_4_ - (float)local_12f8._4_4_;
            local_11f8._0_4_ = local_11f8._4_4_;
            fStack_11f0 = (float)local_11f8._4_4_;
            fStack_11ec = (float)local_11f8._4_4_;
            fVar70 = (float)local_11f8._4_4_ - (float)local_1348._4_4_;
            fVar69 = fVar69 * fVar70;
            auVar137._4_4_ = fVar70;
            auVar137._0_4_ = fVar70;
            auVar137._8_4_ = fVar70;
            auVar137._12_4_ = fVar70;
            local_1208._0_4_ = local_1208._4_4_;
            fStack_1200 = (float)local_1208._4_4_;
            fStack_11fc = (float)local_1208._4_4_;
            fVar140 = (float)local_1208._4_4_ - fVar46;
            local_1048._4_4_ = fVar140;
            local_1048._0_4_ = fVar140;
            local_1048._8_4_ = fVar140;
            local_1048._12_4_ = fVar140;
            fVar70 = fVar71 * fVar140;
            auVar101._4_4_ = fVar70;
            auVar101._0_4_ = fVar70;
            auVar101._8_4_ = fVar70;
            auVar101._12_4_ = fVar70;
            fVar46 = fVar46 - (float)local_1378._4_4_;
            local_1068._4_4_ = fVar46;
            local_1068._0_4_ = fVar46;
            local_1068._8_4_ = fVar46;
            local_1068._12_4_ = fVar46;
            auVar112 = vfmsub231ps_fma(auVar101,auVar137,local_1068);
            fVar11 = (float)local_12c8._4_4_ - (float)local_1218._4_4_;
            fVar70 = fVar11 * fVar46;
            auVar50._4_4_ = fVar70;
            auVar50._0_4_ = fVar70;
            auVar50._8_4_ = fVar70;
            auVar50._12_4_ = fVar70;
            auVar99 = vfmsub231ps_fma(auVar50,local_1048,local_1058);
            local_1088 = vsubps_avx(_local_1218,*(undefined1 (*) [16])ray);
            auVar47 = vsubps_avx(_local_1348,*(undefined1 (*) [16])(ray + 0x10));
            auVar86 = vsubps_avx(auVar88,*(undefined1 (*) [16])(ray + 0x20));
            fVar70 = (float)*(undefined8 *)pRVar5;
            auVar74._0_4_ = fVar70 * local_1088._0_4_;
            fVar108 = (float)((ulong)*(undefined8 *)pRVar5 >> 0x20);
            auVar74._4_4_ = fVar108 * local_1088._4_4_;
            fVar109 = (float)*(undefined8 *)(ray + 0x68);
            auVar74._8_4_ = fVar109 * local_1088._8_4_;
            fVar110 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
            auVar74._12_4_ = fVar110 * local_1088._12_4_;
            auVar111 = vfmsub231ps_fma(auVar74,auVar86,*(undefined1 (*) [16])pRVar6);
            fVar126 = (float)*(undefined8 *)pRVar6;
            auVar51._0_4_ = fVar126 * auVar47._0_4_;
            fVar130 = (float)((ulong)*(undefined8 *)pRVar6 >> 0x20);
            auVar51._4_4_ = fVar130 * auVar47._4_4_;
            fVar131 = (float)*(undefined8 *)(ray + 0x48);
            auVar51._8_4_ = fVar131 * auVar47._8_4_;
            fVar132 = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
            auVar51._12_4_ = fVar132 * auVar47._12_4_;
            auVar18._12_4_ = fStack_11dc;
            auVar18._0_12_ = auVar23;
            local_1078 = vfmsub231ps_fma(auVar51,local_1088,auVar18);
            auVar114._0_4_ = local_1078._0_4_ * fVar140;
            auVar114._4_4_ = local_1078._4_4_ * fVar140;
            auVar114._8_4_ = local_1078._8_4_ * fVar140;
            auVar114._12_4_ = local_1078._12_4_ * fVar140;
            auVar113 = vfmadd231ps_fma(auVar114,auVar111,auVar137);
            auVar75._4_4_ = fVar71;
            auVar75._0_4_ = fVar71;
            auVar75._8_4_ = fVar71;
            auVar75._12_4_ = fVar71;
            auVar52._4_4_ = fVar11;
            auVar52._0_4_ = fVar11;
            auVar52._8_4_ = fVar11;
            auVar52._12_4_ = fVar11;
            auVar138._4_4_ = fVar69;
            auVar138._0_4_ = fVar69;
            auVar138._8_4_ = fVar69;
            auVar138._12_4_ = fVar69;
            auVar13 = vfmsub231ps_fma(auVar138,auVar52,auVar75);
            auVar76._0_4_ = auVar86._0_4_ * auVar23._0_4_;
            auVar76._4_4_ = auVar86._4_4_ * auVar23._4_4_;
            auVar76._8_4_ = auVar86._8_4_ * auVar23._8_4_;
            auVar76._12_4_ = auVar86._12_4_ * fStack_11dc;
            auVar14 = vfmsub231ps_fma(auVar76,*(undefined1 (*) [16])pRVar5,auVar47);
            auVar98 = vfmadd231ps_fma(auVar113,auVar14,auVar52);
            auVar139._0_4_ = auVar13._0_4_ * fVar70;
            auVar139._4_4_ = auVar13._4_4_ * fVar108;
            auVar139._8_4_ = auVar13._8_4_ * fVar109;
            auVar139._12_4_ = auVar13._12_4_ * fVar110;
            auVar113 = vfmadd231ps_fma(auVar139,auVar18,auVar99);
            auVar78 = vfmadd231ps_fma(auVar113,*(undefined1 (*) [16])pRVar6,auVar112);
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar113 = vandps_avx(auVar78,auVar16);
            uVar120 = auVar113._0_4_;
            auVar123._0_4_ = (float)(uVar120 ^ auVar98._0_4_);
            uVar121 = auVar113._4_4_;
            auVar123._4_4_ = (float)(uVar121 ^ auVar98._4_4_);
            uVar122 = auVar113._8_4_;
            auVar123._8_4_ = (float)(uVar122 ^ auVar98._8_4_);
            uVar133 = auVar113._12_4_;
            auVar123._12_4_ = (float)(uVar133 ^ auVar98._12_4_);
            auVar113 = vcmpps_avx(auVar123,_DAT_01feba10,5);
            auVar98 = auVar97 & auVar113;
            local_1168 = (float)*(undefined8 *)(ray + 0x30);
            fStack_1164 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
            fStack_1160 = (float)*(undefined8 *)(ray + 0x38);
            fStack_115c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
            if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar98[0xf] < '\0') {
              auVar113 = vandps_avx(auVar113,auVar97);
              auVar56._0_4_ = local_1078._0_4_ * fVar46;
              auVar56._4_4_ = local_1078._4_4_ * fVar46;
              auVar56._8_4_ = local_1078._8_4_ * fVar46;
              auVar56._12_4_ = local_1078._12_4_ * fVar46;
              auVar98 = vfmadd132ps_fma(auVar75,auVar56,auVar111);
              auVar98 = vfmadd213ps_fma(local_1058,auVar14,auVar98);
              auVar81._0_4_ = (float)(uVar120 ^ auVar98._0_4_);
              auVar81._4_4_ = (float)(uVar121 ^ auVar98._4_4_);
              auVar81._8_4_ = (float)(uVar122 ^ auVar98._8_4_);
              auVar81._12_4_ = (float)(uVar133 ^ auVar98._12_4_);
              auVar98 = vcmpps_avx(auVar81,_DAT_01feba10,5);
              auVar111 = auVar98 & auVar113;
              if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar111[0xf] < '\0') {
                auVar111 = vandps_avx(auVar78,auVar95);
                auVar113 = vandps_avx(auVar113,auVar98);
                auVar98 = vsubps_avx(auVar111,auVar123);
                auVar98 = vcmpps_avx(auVar98,auVar81,5);
                auVar14 = auVar98 & auVar113;
                if ((((auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar14[0xf] < '\0') {
                  auVar113 = vandps_avx(auVar113,auVar98);
                  auVar57._0_4_ = auVar86._0_4_ * auVar13._0_4_;
                  auVar57._4_4_ = auVar86._4_4_ * auVar13._4_4_;
                  auVar57._8_4_ = auVar86._8_4_ * auVar13._8_4_;
                  auVar57._12_4_ = auVar86._12_4_ * auVar13._12_4_;
                  auVar47 = vfmadd132ps_fma(auVar47,auVar57,auVar99);
                  auVar47 = vfmadd132ps_fma(local_1088,auVar47,auVar112);
                  auVar58._0_4_ = (float)(uVar120 ^ auVar47._0_4_);
                  auVar58._4_4_ = (float)(uVar121 ^ auVar47._4_4_);
                  auVar58._8_4_ = (float)(uVar122 ^ auVar47._8_4_);
                  auVar58._12_4_ = (float)(uVar133 ^ auVar47._12_4_);
                  auVar90._0_4_ = auVar111._0_4_ * local_1168;
                  auVar90._4_4_ = auVar111._4_4_ * fStack_1164;
                  auVar90._8_4_ = auVar111._8_4_ * fStack_1160;
                  auVar90._12_4_ = auVar111._12_4_ * fStack_115c;
                  auVar102._0_4_ = auVar111._0_4_ * *(float *)pRVar7;
                  auVar102._4_4_ = auVar111._4_4_ * *(float *)(ray + 0x84);
                  auVar102._8_4_ = auVar111._8_4_ * *(float *)(ray + 0x88);
                  auVar102._12_4_ = auVar111._12_4_ * *(float *)(ray + 0x8c);
                  auVar47 = vcmpps_avx(auVar90,auVar58,1);
                  auVar86 = vcmpps_avx(auVar58,auVar102,2);
                  auVar47 = vandps_avx(auVar47,auVar86);
                  auVar86 = auVar113 & auVar47;
                  if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar86[0xf] < '\0') {
                    auVar113 = vandps_avx(auVar47,auVar113);
                    auVar47 = vcmpps_avx(auVar78,_DAT_01feba10,4);
                    auVar86 = auVar47 & auVar113;
                    if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar86[0xf] < '\0') {
                      uVar120 = ((context->scene->geometries).items[uVar31].ptr)->mask;
                      auVar103._4_4_ = uVar120;
                      auVar103._0_4_ = uVar120;
                      auVar103._8_4_ = uVar120;
                      auVar103._12_4_ = uVar120;
                      auVar113 = vandps_avx(auVar113,auVar47);
                      auVar47 = vpand_avx(auVar103,*(undefined1 (*) [16])(ray + 0x90));
                      auVar47 = vpcmpeqd_avx(auVar47,_DAT_01feba10);
                      auVar86 = auVar113 & ~auVar47;
                      if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar86[0xf] < '\0') {
                        auVar86 = vrcpps_avx(auVar111);
                        auVar116._8_4_ = 0x3f800000;
                        auVar116._0_8_ = &DAT_3f8000003f800000;
                        auVar116._12_4_ = 0x3f800000;
                        auVar98 = vfnmadd213ps_fma(auVar111,auVar86,auVar116);
                        auVar86 = vfmadd132ps_fma(auVar98,auVar86,auVar86);
                        fVar46 = auVar86._0_4_;
                        auVar82._0_4_ = fVar46 * auVar81._0_4_;
                        fVar69 = auVar86._4_4_;
                        auVar82._4_4_ = fVar69 * auVar81._4_4_;
                        fVar71 = auVar86._8_4_;
                        auVar82._8_4_ = fVar71 * auVar81._8_4_;
                        fVar140 = auVar86._12_4_;
                        auVar82._12_4_ = fVar140 * auVar81._12_4_;
                        auVar86 = vminps_avx(auVar82,auVar116);
                        auVar98 = vsubps_avx(auVar116,auVar86);
                        auVar21._8_8_ = uVar28;
                        auVar21._0_8_ = uVar27;
                        auVar86 = vblendvps_avx(auVar86,auVar98,auVar21);
                        auVar47 = vandnps_avx(auVar47,auVar113);
                        auVar91._0_4_ = fVar46 * auVar123._0_4_;
                        auVar91._4_4_ = fVar69 * auVar123._4_4_;
                        auVar91._8_4_ = fVar71 * auVar123._8_4_;
                        auVar91._12_4_ = fVar140 * auVar123._12_4_;
                        auVar113 = vminps_avx(auVar91,auVar116);
                        auVar98 = vsubps_avx(auVar116,auVar113);
                        auVar98 = vblendvps_avx(auVar113,auVar98,auVar21);
                        auVar59._0_4_ = fVar46 * auVar58._0_4_;
                        auVar59._4_4_ = fVar69 * auVar58._4_4_;
                        auVar59._8_4_ = fVar71 * auVar58._8_4_;
                        auVar59._12_4_ = fVar140 * auVar58._12_4_;
                        uVar32 = *(undefined4 *)((long)&local_1398 + lVar40 * 4);
                        auVar104._4_4_ = uVar32;
                        auVar104._0_4_ = uVar32;
                        auVar104._8_4_ = uVar32;
                        auVar104._12_4_ = uVar32;
                        auVar113 = vmaskmovps_avx(auVar47,auVar59);
                        *(undefined1 (*) [16])pRVar7 = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar112);
                        *(undefined1 (*) [16])(ray + 0xc0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar99);
                        *(undefined1 (*) [16])(ray + 0xd0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar13);
                        *(undefined1 (*) [16])(ray + 0xe0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar98);
                        *(undefined1 (*) [16])(ray + 0xf0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar86);
                        *(undefined1 (*) [16])(ray + 0x100) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar104);
                        *(undefined1 (*) [16])(ray + 0x110) = auVar113;
                        auVar60._4_4_ = uVar31;
                        auVar60._0_4_ = uVar31;
                        auVar60._8_4_ = uVar31;
                        auVar60._12_4_ = uVar31;
                        auVar113 = vmaskmovps_avx(auVar47,auVar60);
                        *(undefined1 (*) [16])(ray + 0x120) = auVar113;
                        uVar31 = context->user->instID[0];
                        auVar61._4_4_ = uVar31;
                        auVar61._0_4_ = uVar31;
                        auVar61._8_4_ = uVar31;
                        auVar61._12_4_ = uVar31;
                        auVar113 = vmaskmovps_avx(auVar47,auVar61);
                        *(undefined1 (*) [16])(ray + 0x130) = auVar113;
                        uVar31 = context->user->instPrimID[0];
                        auVar62._4_4_ = uVar31;
                        auVar62._0_4_ = uVar31;
                        auVar62._8_4_ = uVar31;
                        auVar62._12_4_ = uVar31;
                        auVar113 = vmaskmovps_avx(auVar47,auVar62);
                        *(undefined1 (*) [16])(ray + 0x140) = auVar113;
                      }
                    }
                  }
                }
              }
            }
            auVar47 = vsubps_avx(local_1238,_local_12c8);
            auVar86 = vsubps_avx(local_1248,_local_11f8);
            auVar98 = vsubps_avx(local_1258,_local_1208);
            auVar78 = vsubps_avx(_local_12e8,local_1238);
            auVar113 = vsubps_avx(_local_12f8,local_1248);
            auVar112 = vsubps_avx(_local_1378,local_1258);
            auVar53._0_4_ = auVar86._0_4_ * auVar112._0_4_;
            auVar53._4_4_ = auVar86._4_4_ * auVar112._4_4_;
            auVar53._8_4_ = auVar86._8_4_ * auVar112._8_4_;
            auVar53._12_4_ = auVar86._12_4_ * auVar112._12_4_;
            auVar15 = vfmsub231ps_fma(auVar53,auVar113,auVar98);
            auVar115._0_4_ = auVar78._0_4_ * auVar98._0_4_;
            auVar115._4_4_ = auVar78._4_4_ * auVar98._4_4_;
            auVar115._8_4_ = auVar78._8_4_ * auVar98._8_4_;
            auVar115._12_4_ = auVar78._12_4_ * auVar98._12_4_;
            auVar48 = vfmsub231ps_fma(auVar115,auVar47,auVar112);
            auVar80._0_4_ = auVar113._0_4_ * auVar47._0_4_;
            auVar80._4_4_ = auVar113._4_4_ * auVar47._4_4_;
            auVar80._8_4_ = auVar113._8_4_ * auVar47._8_4_;
            auVar80._12_4_ = auVar113._12_4_ * auVar47._12_4_;
            auVar73 = vfmsub231ps_fma(auVar80,auVar78,auVar86);
            auVar99 = vsubps_avx(local_1238,*(undefined1 (*) [16])ray);
            auVar111 = vsubps_avx(local_1248,*(undefined1 (*) [16])(ray + 0x10));
            auVar13 = vsubps_avx(local_1258,*(undefined1 (*) [16])(ray + 0x20));
            auVar124._0_4_ = auVar13._0_4_ * local_11e8;
            auVar124._4_4_ = auVar13._4_4_ * fStack_11e4;
            auVar124._8_4_ = auVar13._8_4_ * fStack_11e0;
            auVar124._12_4_ = auVar13._12_4_ * fStack_11dc;
            auVar79 = vfmsub231ps_fma(auVar124,auVar111,*(undefined1 (*) [16])pRVar5);
            auVar77._0_4_ = fVar70 * auVar99._0_4_;
            auVar77._4_4_ = fVar108 * auVar99._4_4_;
            auVar77._8_4_ = fVar109 * auVar99._8_4_;
            auVar77._12_4_ = fVar110 * auVar99._12_4_;
            auVar87 = vfmsub231ps_fma(auVar77,auVar13,*(undefined1 (*) [16])pRVar6);
            auVar89._0_4_ = fVar126 * auVar111._0_4_;
            auVar89._4_4_ = fVar130 * auVar111._4_4_;
            auVar89._8_4_ = fVar131 * auVar111._8_4_;
            auVar89._12_4_ = fVar132 * auVar111._12_4_;
            auVar19._12_4_ = fStack_11dc;
            auVar19._0_12_ = *(undefined1 (*) [12])pRVar4;
            auVar100 = vfmsub231ps_fma(auVar89,auVar99,auVar19);
            auVar129._0_4_ = fVar70 * auVar73._0_4_;
            auVar129._4_4_ = fVar108 * auVar73._4_4_;
            auVar129._8_4_ = fVar109 * auVar73._8_4_;
            auVar129._12_4_ = fVar110 * auVar73._12_4_;
            auVar14 = vfmadd231ps_fma(auVar129,auVar48,auVar19);
            auVar14 = vfmadd231ps_fma(auVar14,auVar15,*(undefined1 (*) [16])pRVar6);
            auVar54._0_4_ = auVar100._0_4_ * auVar112._0_4_;
            auVar54._4_4_ = auVar100._4_4_ * auVar112._4_4_;
            auVar54._8_4_ = auVar100._8_4_ * auVar112._8_4_;
            auVar54._12_4_ = auVar100._12_4_ * auVar112._12_4_;
            auVar112 = vfmadd231ps_fma(auVar54,auVar87,auVar113);
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar113 = vandps_avx(auVar14,auVar17);
            auVar78 = vfmadd231ps_fma(auVar112,auVar79,auVar78);
            uVar31 = auVar113._0_4_;
            auVar55._0_4_ = (float)(uVar31 ^ auVar78._0_4_);
            uVar120 = auVar113._4_4_;
            auVar55._4_4_ = (float)(uVar120 ^ auVar78._4_4_);
            uVar121 = auVar113._8_4_;
            auVar55._8_4_ = (float)(uVar121 ^ auVar78._8_4_);
            uVar122 = auVar113._12_4_;
            auVar55._12_4_ = (float)(uVar122 ^ auVar78._12_4_);
            auVar113 = vcmpps_avx(auVar55,_DAT_01feba10,5);
            auVar78 = auVar97 & auVar113;
            auVar112 = ZEXT816(0) << 0x20;
            auVar125 = ZEXT864(0) << 0x20;
            if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar78[0xf] < '\0') {
              auVar113 = vandps_avx(auVar113,auVar97);
              auVar63._0_4_ = auVar100._0_4_ * auVar98._0_4_;
              auVar63._4_4_ = auVar100._4_4_ * auVar98._4_4_;
              auVar63._8_4_ = auVar100._8_4_ * auVar98._8_4_;
              auVar63._12_4_ = auVar100._12_4_ * auVar98._12_4_;
              auVar86 = vfmadd132ps_fma(auVar86,auVar63,auVar87);
              auVar47 = vfmadd213ps_fma(auVar47,auVar79,auVar86);
              auVar92._0_4_ = (float)(uVar31 ^ auVar47._0_4_);
              auVar92._4_4_ = (float)(uVar120 ^ auVar47._4_4_);
              auVar92._8_4_ = (float)(uVar121 ^ auVar47._8_4_);
              auVar92._12_4_ = (float)(uVar122 ^ auVar47._12_4_);
              auVar47 = vcmpps_avx(auVar92,auVar112,5);
              auVar86 = auVar47 & auVar113;
              if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar86[0xf] < '\0') {
                auVar86 = vandps_avx(auVar14,auVar95);
                auVar113 = vandps_avx(auVar113,auVar47);
                auVar47 = vsubps_avx(auVar86,auVar55);
                auVar47 = vcmpps_avx(auVar47,auVar92,5);
                auVar98 = auVar47 & auVar113;
                if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar98[0xf] < '\0') {
                  auVar113 = vandps_avx(auVar113,auVar47);
                  auVar64._0_4_ = auVar13._0_4_ * auVar73._0_4_;
                  auVar64._4_4_ = auVar13._4_4_ * auVar73._4_4_;
                  auVar64._8_4_ = auVar13._8_4_ * auVar73._8_4_;
                  auVar64._12_4_ = auVar13._12_4_ * auVar73._12_4_;
                  auVar47 = vfmadd132ps_fma(auVar111,auVar64,auVar48);
                  auVar47 = vfmadd213ps_fma(auVar99,auVar15,auVar47);
                  auVar117._0_4_ = (float)(uVar31 ^ auVar47._0_4_);
                  auVar117._4_4_ = (float)(uVar120 ^ auVar47._4_4_);
                  auVar117._8_4_ = (float)(uVar121 ^ auVar47._8_4_);
                  auVar117._12_4_ = (float)(uVar122 ^ auVar47._12_4_);
                  auVar83._0_4_ = auVar86._0_4_ * local_1168;
                  auVar83._4_4_ = auVar86._4_4_ * fStack_1164;
                  auVar83._8_4_ = auVar86._8_4_ * fStack_1160;
                  auVar83._12_4_ = auVar86._12_4_ * fStack_115c;
                  auVar105._0_4_ = auVar86._0_4_ * *(float *)pRVar7;
                  auVar105._4_4_ = auVar86._4_4_ * *(float *)(ray + 0x84);
                  auVar105._8_4_ = auVar86._8_4_ * *(float *)(ray + 0x88);
                  auVar105._12_4_ = auVar86._12_4_ * *(float *)(ray + 0x8c);
                  auVar47 = vcmpps_avx(auVar83,auVar117,1);
                  auVar98 = vcmpps_avx(auVar117,auVar105,2);
                  auVar47 = vandps_avx(auVar47,auVar98);
                  auVar98 = auVar113 & auVar47;
                  if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar98[0xf] < '\0') {
                    auVar113 = vandps_avx(auVar47,auVar113);
                    auVar47 = vcmpps_avx(auVar14,auVar112,4);
                    auVar98 = auVar47 & auVar113;
                    if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar98[0xf] < '\0') {
                      uVar120 = *(uint *)(lVar39 + lVar40 * 4);
                      uVar31 = ((context->scene->geometries).items[uVar120].ptr)->mask;
                      auVar106._4_4_ = uVar31;
                      auVar106._0_4_ = uVar31;
                      auVar106._8_4_ = uVar31;
                      auVar106._12_4_ = uVar31;
                      auVar113 = vandps_avx(auVar113,auVar47);
                      auVar47 = vpand_avx(auVar106,*(undefined1 (*) [16])(ray + 0x90));
                      auVar47 = vpcmpeqd_avx(auVar112,auVar47);
                      auVar98 = auVar113 & ~auVar47;
                      if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar98[0xf] < '\0') {
                        auVar98 = vrcpps_avx(auVar86);
                        auVar118._8_4_ = 0x3f800000;
                        auVar118._0_8_ = &DAT_3f8000003f800000;
                        auVar118._12_4_ = 0x3f800000;
                        auVar86 = vfnmadd213ps_fma(auVar86,auVar98,auVar118);
                        auVar86 = vfmadd132ps_fma(auVar86,auVar98,auVar98);
                        fVar46 = auVar86._0_4_;
                        auVar93._0_4_ = fVar46 * auVar92._0_4_;
                        fVar69 = auVar86._4_4_;
                        auVar93._4_4_ = fVar69 * auVar92._4_4_;
                        fVar70 = auVar86._8_4_;
                        auVar93._8_4_ = fVar70 * auVar92._8_4_;
                        fVar71 = auVar86._12_4_;
                        auVar93._12_4_ = fVar71 * auVar92._12_4_;
                        auVar86 = vminps_avx(auVar93,auVar118);
                        auVar98 = vsubps_avx(auVar118,auVar86);
                        auVar20._8_8_ = uVar30;
                        auVar20._0_8_ = uVar29;
                        auVar86 = vblendvps_avx(auVar86,auVar98,auVar20);
                        auVar47 = vandnps_avx(auVar47,auVar113);
                        auVar84._0_4_ = fVar46 * auVar55._0_4_;
                        auVar84._4_4_ = fVar69 * auVar55._4_4_;
                        auVar84._8_4_ = fVar70 * auVar55._8_4_;
                        auVar84._12_4_ = fVar71 * auVar55._12_4_;
                        auVar113 = vminps_avx(auVar84,auVar118);
                        auVar98 = vsubps_avx(auVar118,auVar113);
                        auVar98 = vblendvps_avx(auVar113,auVar98,auVar20);
                        auVar65._0_4_ = fVar46 * auVar117._0_4_;
                        auVar65._4_4_ = fVar69 * auVar117._4_4_;
                        auVar65._8_4_ = fVar70 * auVar117._8_4_;
                        auVar65._12_4_ = fVar71 * auVar117._12_4_;
                        uVar32 = *(undefined4 *)((long)&local_1398 + lVar40 * 4);
                        auVar107._4_4_ = uVar32;
                        auVar107._0_4_ = uVar32;
                        auVar107._8_4_ = uVar32;
                        auVar107._12_4_ = uVar32;
                        auVar113 = vmaskmovps_avx(auVar47,auVar65);
                        *(undefined1 (*) [16])pRVar7 = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar15);
                        *(undefined1 (*) [16])(ray + 0xc0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar48);
                        *(undefined1 (*) [16])(ray + 0xd0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar73);
                        *(undefined1 (*) [16])(ray + 0xe0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar98);
                        *(undefined1 (*) [16])(ray + 0xf0) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar86);
                        *(undefined1 (*) [16])(ray + 0x100) = auVar113;
                        auVar113 = vmaskmovps_avx(auVar47,auVar107);
                        *(undefined1 (*) [16])(ray + 0x110) = auVar113;
                        auVar66._4_4_ = uVar120;
                        auVar66._0_4_ = uVar120;
                        auVar66._8_4_ = uVar120;
                        auVar66._12_4_ = uVar120;
                        auVar113 = vmaskmovps_avx(auVar47,auVar66);
                        *(undefined1 (*) [16])(ray + 0x120) = auVar113;
                        uVar31 = context->user->instID[0];
                        auVar67._4_4_ = uVar31;
                        auVar67._0_4_ = uVar31;
                        auVar67._8_4_ = uVar31;
                        auVar67._12_4_ = uVar31;
                        auVar113 = vmaskmovps_avx(auVar47,auVar67);
                        *(undefined1 (*) [16])(ray + 0x130) = auVar113;
                        uVar31 = context->user->instPrimID[0];
                        auVar68._4_4_ = uVar31;
                        auVar68._0_4_ = uVar31;
                        auVar68._8_4_ = uVar31;
                        auVar68._12_4_ = uVar31;
                        auVar113 = vmaskmovps_avx(auVar47,auVar68);
                        *(undefined1 (*) [16])(ray + 0x140) = auVar113;
                      }
                    }
                  }
                }
              }
            }
            lVar40 = lVar40 + 1;
          } while (lVar40 != 4);
          lVar36 = lVar36 + 1;
          lVar39 = lVar39 + 0xe0;
        } while (lVar36 != uVar33 - 8);
      }
      auVar113 = vcmpps_avx(*(undefined1 (*) [16])pRVar7,local_1338,1);
      auVar113 = auVar97 & auVar113;
    } while ((((auVar113 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar113 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar113 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar113[0xf]);
    local_1338 = vblendvps_avx(local_1338,*(undefined1 (*) [16])pRVar7,auVar97);
    auVar97 = vshufps_avx(local_1338,local_1338,0xb1);
    auVar97 = vmaxps_avx(auVar97,local_1338);
    auVar113 = vshufpd_avx(auVar97,auVar97,1);
    auVar98 = vmaxss_avx(auVar113,auVar97);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }